

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.cc
# Opt level: O0

bool MathUtil::RealRootsForCubic
               (longdouble a,longdouble b,longdouble c,longdouble *r1,longdouble *r2,longdouble *r3)

{
  int __x;
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  longdouble in_ST1;
  longdouble lVar3;
  longdouble lVar4;
  double dVar5;
  double dVar6;
  longdouble A;
  longdouble minus_two_root_Q;
  longdouble theta_third;
  longdouble two_pi_third;
  longdouble root_Q;
  longdouble Q_cubed;
  longdouble R_squared;
  longdouble R;
  longdouble Q;
  longdouble b_tripled;
  longdouble a_third;
  longdouble a_squared;
  longdouble *r3_local;
  longdouble *r2_local;
  longdouble *r1_local;
  longdouble c_local;
  longdouble b_local;
  longdouble a_local;
  undefined1 local_9;
  
  __x = (int)r1;
  lVar1 = a * a;
  lVar2 = (longdouble)3.0;
  lVar3 = a / lVar2;
  lVar4 = (lVar1 - b * lVar2) / (longdouble)9.0;
  lVar1 = ((longdouble)27.0 * c + (a * (lVar1 + lVar1) - b * lVar2 * lVar2 * a)) / (longdouble)54.0;
  lVar2 = lVar4 * lVar4 * lVar4;
  if (lVar2 <= lVar1 * lVar1) {
    anon_unknown.dwarf_546915::sgn<long_double>(r1,lVar1);
    std::abs(__x);
    dVar5 = sqrt((double)(lVar1 * lVar1 - lVar2));
    dVar5 = pow((double)((longdouble)dVar5 + in_ST1),0.3333333333333333);
    lVar1 = (longdouble)dVar5 * -in_ST0;
    if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
      *r1 = (lVar4 / lVar1 + lVar1) - lVar3;
      local_9 = false;
    }
    else {
      lVar3 = -lVar3;
      *r3 = lVar3;
      *r2 = lVar3;
      *r1 = lVar3;
      local_9 = true;
    }
  }
  else {
    dVar5 = sqrt((double)lVar4);
    dVar6 = sqrt((double)lVar2);
    dVar6 = acos((double)(lVar1 / (longdouble)dVar6));
    dVar6 = dVar6 / 3.0;
    lVar1 = (longdouble)-2.0 * (longdouble)dVar5;
    dVar5 = cos(dVar6);
    *r1 = lVar1 * (longdouble)dVar5 - lVar3;
    dVar5 = cos(dVar6 + 2.0943951023931953);
    *r2 = lVar1 * (longdouble)dVar5 - lVar3;
    dVar5 = cos(dVar6 - 2.0943951023931953);
    *r3 = lVar1 * (longdouble)dVar5 - lVar3;
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool MathUtil::RealRootsForCubic(long double const a,
                                 long double const b,
                                 long double const c,
                                 long double *const r1,
                                 long double *const r2,
                                 long double *const r3) {
  // According to Numerical Recipes (pp. 184-5), what
  // follows is an arrangement of computations to
  // compute the roots of a cubic that minimizes
  // roundoff error (as pointed out by A.J. Glassman).

  long double const a_squared = a * a, a_third = a / 3.0, b_tripled = 3.0 * b;
  long double const Q = (a_squared - b_tripled) / 9.0;
  long double const R =
      (2.0 * a_squared * a - 3.0 * a * b_tripled + 27.0 * c) / 54.0;

  long double const R_squared = R * R;
  long double const Q_cubed = Q * Q * Q;

  if (R_squared < Q_cubed) {
    long double const root_Q = sqrt(Q);
    long double const two_pi_third = 2.0 * M_PI / 3.0;
    long double const theta_third = acos(R / sqrt(Q_cubed)) / 3.0;
    long double const minus_two_root_Q = -2.0 * root_Q;

    *r1 = minus_two_root_Q * cos(theta_third) - a_third;
    *r2 = minus_two_root_Q * cos(theta_third + two_pi_third) - a_third;
    *r3 = minus_two_root_Q * cos(theta_third - two_pi_third) - a_third;

    return true;
  }

  long double const A =
    -sgn(R) * pow(std::abs(R) + sqrt(R_squared - Q_cubed), 1.0 / 3.0L);

  if (A != 0.0) {  // in which case, B from NR is zero
    *r1 = A + Q / A - a_third;
    return false;
  }

  *r1 = *r2 = *r3 = -a_third;
  return true;
}